

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::
       createPerQuads<deqp::gls::GLValue::WrappedType<unsigned_int>>
                 (int seed,int count,int componentCount,int stride,Primitive primitive,
                 WrappedType<unsigned_int> min,WrappedType<unsigned_int> max)

{
  int iVar1;
  int iVar2;
  Uint UVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  deRandom rnd;
  deRandom local_40;
  
  deRandom_init(&local_40,seed);
  iVar6 = componentCount * 4;
  if (stride != 0) {
    iVar6 = stride;
  }
  iVar1 = iVar6 * 6;
  uVar7 = 0;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar1 = 0;
  }
  pcVar4 = (char *)operator_new__((long)(iVar1 * count));
  uVar8 = (ulong)(uint)componentCount;
  if (componentCount < 1) {
    uVar8 = uVar7;
  }
  uVar9 = (ulong)(uint)count;
  if (count < 1) {
    uVar9 = uVar7;
  }
  for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
    iVar2 = iVar1 * (int)uVar7;
    for (lVar10 = 0; uVar8 << 2 != lVar10; lVar10 = lVar10 + 4) {
      UVar3 = getRandom<deqp::gls::GLValue::WrappedType<unsigned_int>>
                        (&local_40,min.m_value,max.m_value);
      lVar5 = (long)(int)lVar10;
      *(uint *)(pcVar4 + lVar5 + iVar2) = UVar3.m_value;
      *(uint *)(pcVar4 + lVar5 + (long)iVar6 + (long)iVar2) = UVar3.m_value;
      *(uint *)(pcVar4 + lVar5 + (long)(iVar6 * 2) + (long)iVar2) = UVar3.m_value;
      *(uint *)(pcVar4 + lVar5 + (long)(iVar6 * 3) + (long)iVar2) = UVar3.m_value;
      *(uint *)(pcVar4 + lVar5 + (long)(iVar6 * 4) + (long)iVar2) = UVar3.m_value;
      *(uint *)(pcVar4 + lVar5 + (long)(iVar6 * 5) + (long)iVar2) = UVar3.m_value;
    }
  }
  return pcVar4;
}

Assistant:

char* RandomArrayGenerator::createPerQuads (int seed, int count, int componentCount, int stride, Array::Primitive primitive, T min, T max)
{
	deRandom rnd;
	deRandom_init(&rnd, seed);

	int componentStride = sizeof(T);

	if (stride == 0)
		stride = componentStride * componentCount;

	int quadStride = 0;

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* data = new char[count * quadStride];

	for (int quadNdx = 0; quadNdx < count; quadNdx++)
	{
		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			T val = getRandom<T>(rnd, min, max);

			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 0 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 1 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 2 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 3 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 4 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 5 + componentStride * componentNdx, val);
		}
	}

	return data;
}